

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::PortalImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,PortalImageInfiniteLight *p,Transform *args,
          Image *args_1,RGBColorSpace **args_2,float *args_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *args_5,
          polymorphic_allocator<std::byte> *args_6)

{
  Float scale;
  RGBColorSpace *imageColorSpace;
  _Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> local_d8;
  Image local_c0;
  
  pbrt::Image::Image(&local_c0,args_1);
  scale = *args_3;
  imageColorSpace = *args_2;
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)&local_d8,args_5)
  ;
  pbrt::PortalImageInfiniteLight::PortalImageInfiniteLight
            (p,args,&local_c0,imageColorSpace,scale,args_4,
             (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)&local_d8,
             args_6->memoryResource);
  std::_Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~_Vector_base
            (&local_d8);
  pbrt::Image::~Image(&local_c0);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }